

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

GenericClassDefSymbol * __thiscall
slang::TypedBumpAllocator<slang::ast::GenericClassDefSymbol>::
emplace<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *this,
          basic_string_view<char,_std::char_traits<char>_> *args,SourceLocation *args_1)

{
  string_view name;
  GenericClassDefSymbol *pGVar1;
  BumpAllocator *in_RDX;
  GenericClassDefSymbol *in_stack_00000008;
  SourceLocation in_stack_00000010;
  size_t in_stack_00000018;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pGVar1 = (GenericClassDefSymbol *)
           BumpAllocator::allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  name._M_str = (char *)args_1;
  name._M_len = in_stack_00000018;
  ast::GenericClassDefSymbol::GenericClassDefSymbol(in_stack_00000008,name,in_stack_00000010);
  return pGVar1;
}

Assistant:

T* emplace(Args&&... args) {
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }